

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::EnhancedLayouts::XFBCaptureInactiveOutputBlockMemberTest::verifyBuffers
          (XFBCaptureInactiveOutputBlockMemberTest *this,bufferCollection *buffers)

{
  ostringstream *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  pointer ppVar4;
  Buffer *this_01;
  bufferDescriptor *pbVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  undefined4 extraout_var;
  char *pcVar12;
  GLchar *__s;
  size_t sVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  ppVar4 = (buffers->m_vector).
           super__Vector_base<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_01 = ppVar4[1].m_buffer;
  pbVar5 = ppVar4[1].m_descriptor;
  Utils::Buffer::Bind(this_01);
  iVar11 = (*this_01->m_context->m_renderCtx->_vptr_RenderContext[3])();
  pcVar12 = (char *)Utils::Buffer::Map((Functions *)CONCAT44(extraout_var,iVar11),this_01->m_buffer,
                                       ReadOnly);
  pcVar6 = *(char **)&(pbVar5->m_expected_data).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
  auVar15[0] = -(*pcVar6 == *pcVar12);
  auVar15[1] = -(pcVar6[1] == pcVar12[1]);
  auVar15[2] = -(pcVar6[2] == pcVar12[2]);
  auVar15[3] = -(pcVar6[3] == pcVar12[3]);
  auVar15[4] = -(pcVar6[4] == pcVar12[4]);
  auVar15[5] = -(pcVar6[5] == pcVar12[5]);
  auVar15[6] = -(pcVar6[6] == pcVar12[6]);
  auVar15[7] = -(pcVar6[7] == pcVar12[7]);
  auVar15[8] = -(pcVar6[8] == pcVar12[8]);
  auVar15[9] = -(pcVar6[9] == pcVar12[9]);
  auVar15[10] = -(pcVar6[10] == pcVar12[10]);
  auVar15[0xb] = -(pcVar6[0xb] == pcVar12[0xb]);
  auVar15[0xc] = -(pcVar6[0xc] == pcVar12[0xc]);
  auVar15[0xd] = -(pcVar6[0xd] == pcVar12[0xd]);
  auVar15[0xe] = -(pcVar6[0xe] == pcVar12[0xe]);
  auVar15[0xf] = -(pcVar6[0xf] == pcVar12[0xf]);
  uVar1 = *(undefined8 *)(pcVar12 + 0x18);
  uVar2 = *(undefined8 *)(pcVar12 + 0x10);
  uVar3 = *(undefined8 *)(pcVar6 + 0x18);
  auVar16[0] = -((char)*(undefined8 *)(pcVar6 + 0x10) == (char)uVar2);
  auVar16[1] = -((char)((ulong)*(undefined8 *)(pcVar6 + 0x10) >> 8) == (char)((ulong)uVar2 >> 8));
  auVar16[2] = -(pcVar6[0x12] == (char)((ulong)uVar2 >> 0x10));
  auVar16[3] = -(pcVar6[0x13] == (char)((ulong)uVar2 >> 0x18));
  auVar16[4] = -(pcVar6[0x14] == (char)((ulong)uVar2 >> 0x20));
  auVar16[5] = -(pcVar6[0x15] == (char)((ulong)uVar2 >> 0x28));
  auVar16[6] = -(pcVar6[0x16] == (char)((ulong)uVar2 >> 0x30));
  auVar16[7] = -(pcVar6[0x17] == (char)((ulong)uVar2 >> 0x38));
  auVar16[8] = -(pcVar6[0x18] == (char)uVar1);
  auVar16[9] = -((char)((ulong)uVar3 >> 8) == (char)((ulong)uVar1 >> 8));
  auVar16[10] = -((char)((ulong)uVar3 >> 0x10) == (char)((ulong)uVar1 >> 0x10));
  auVar16[0xb] = -((char)((ulong)uVar3 >> 0x18) == (char)((ulong)uVar1 >> 0x18));
  auVar16[0xc] = -((char)((ulong)uVar3 >> 0x20) == (char)((ulong)uVar1 >> 0x20));
  auVar16[0xd] = -((char)((ulong)uVar3 >> 0x28) == (char)((ulong)uVar1 >> 0x28));
  auVar16[0xe] = -((char)((ulong)uVar3 >> 0x30) == (char)((ulong)uVar1 >> 0x30));
  auVar16[0xf] = -((char)((ulong)uVar3 >> 0x38) == (char)((ulong)uVar1 >> 0x38));
  auVar16 = auVar16 & auVar15;
  lVar7 = *(long *)(pcVar6 + 0x30);
  lVar8 = *(long *)(pcVar6 + 0x38);
  lVar9 = *(long *)(pcVar12 + 0x38);
  lVar10 = *(long *)(pcVar12 + 0x30);
  bVar14 = (ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                   (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) == 0xffff;
  if (!bVar14 || (lVar7 != lVar10 || lVar8 != lVar9)) {
    local_1a8._0_8_ =
         ((this->super_BufferTestBase).super_TestBase.super_TestCase.m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Invalid result. Buffer: ",0x18);
    __s = Utils::Buffer::GetBufferName(pbVar5->m_target);
    sVar13 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,__s,sVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,". Index: ",9);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_130);
  }
  Utils::Buffer::UnMap(this_01);
  return bVar14 && (lVar7 == lVar10 && lVar8 == lVar9);
}

Assistant:

bool XFBCaptureInactiveOutputBlockMemberTest::verifyBuffers(bufferCollection& buffers)
{
	bool result = true;

	bufferCollection::pair& pair	   = buffers.m_vector[1] /* xfb */;
	Utils::Buffer*			buffer	 = pair.m_buffer;
	bufferDescriptor*		descriptor = pair.m_descriptor;

	/* Get pointer to contents of buffer */
	buffer->Bind();
	GLubyte* buffer_data = (GLubyte*)buffer->Map(Utils::Buffer::ReadOnly);

	/* Get pointer to expected data */
	GLubyte* expected_data = (GLubyte*)&descriptor->m_expected_data[0];

	/* Compare */
	static const GLuint vec4_size = 16;

	int res_before = memcmp(buffer_data, expected_data, vec4_size);
	int res_gohan  = memcmp(buffer_data + 1 * vec4_size, expected_data + 1 * vec4_size, vec4_size);
	int res_chichi = memcmp(buffer_data + 3 * vec4_size, expected_data + 3 * vec4_size, vec4_size);

	if ((0 != res_before) || (0 != res_gohan) || (0 != res_chichi))
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Invalid result. Buffer: " << Utils::Buffer::GetBufferName(descriptor->m_target)
			<< ". Index: " << descriptor->m_index << tcu::TestLog::EndMessage;

		result = false;
	}

	/* Release buffer mapping */
	buffer->UnMap();

	return result;
}